

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O2

void jinit_huff_decoder(j_decompress_ptr cinfo)

{
  jpeg_entropy_decoder *pjVar1;
  int (*paiVar2) [64];
  int iVar3;
  long lVar4;
  
  pjVar1 = (jpeg_entropy_decoder *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x170);
  cinfo->entropy = pjVar1;
  pjVar1->start_pass = start_pass_huff_decoder;
  if (cinfo->progressive_mode == 0) {
    for (lVar4 = -0x20; lVar4 != 0; lVar4 = lVar4 + 8) {
      *(undefined8 *)((long)&pjVar1[10].decode_mcu + lVar4) = 0;
      *(undefined8 *)((long)&pjVar1[8].decode_mcu + lVar4) = 0;
    }
  }
  else {
    paiVar2 = (int (*) [64])
              (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,(long)cinfo->num_components << 8);
    cinfo->coef_bits = paiVar2;
    for (iVar3 = 0; iVar3 < cinfo->num_components; iVar3 = iVar3 + 1) {
      for (lVar4 = 0; (int)lVar4 != 0x100; lVar4 = lVar4 + 4) {
        *(undefined4 *)((long)*paiVar2 + lVar4) = 0xffffffff;
      }
      paiVar2 = (int (*) [64])((long)*paiVar2 + lVar4);
    }
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      (&pjVar1[4].start_pass)[lVar4] = (_func_void_j_decompress_ptr *)0x0;
    }
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_huff_decoder (j_decompress_ptr cinfo)
{
  huff_entropy_ptr entropy;
  int i;

  entropy = (huff_entropy_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(huff_entropy_decoder));
  cinfo->entropy = (struct jpeg_entropy_decoder *) entropy;
  entropy->pub.start_pass = start_pass_huff_decoder;

  if (cinfo->progressive_mode) {
    /* Create progression status table */
    int *coef_bit_ptr, ci;
    cinfo->coef_bits = (int (*)[DCTSIZE2])
      (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				  cinfo->num_components*DCTSIZE2*SIZEOF(int));
    coef_bit_ptr = & cinfo->coef_bits[0][0];
    for (ci = 0; ci < cinfo->num_components; ci++)
      for (i = 0; i < DCTSIZE2; i++)
	*coef_bit_ptr++ = -1;

    /* Mark derived tables unallocated */
    for (i = 0; i < NUM_HUFF_TBLS; i++) {
      entropy->derived_tbls[i] = NULL;
    }
  } else {
    /* Mark tables unallocated */
    for (i = 0; i < NUM_HUFF_TBLS; i++) {
      entropy->dc_derived_tbls[i] = entropy->ac_derived_tbls[i] = NULL;
    }
  }
}